

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_restoreScaleAndLoc(void)

{
  bool bVar1;
  AActor *pAVar2;
  double dVar3;
  
  m_w = old_m_w;
  m_h = old_m_h;
  bVar1 = FBoolCVar::operator_cast_to_bool(&am_followplayer);
  if (bVar1) {
    pAVar2 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    dVar3 = AActor::X(pAVar2);
    m_x = dVar3 - m_w / 2.0;
    pAVar2 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    dVar3 = AActor::Y(pAVar2);
    m_y = dVar3 - m_h / 2.0;
  }
  else {
    m_x = old_m_x;
    m_y = old_m_y;
  }
  m_x2 = m_x + m_w;
  m_y2 = m_y + m_h;
  scale_mtof = (double)f_w / m_w;
  scale_ftom = 1.0 / ((double)f_w / m_w);
  return;
}

Assistant:

void AM_restoreScaleAndLoc ()
{
	m_w = old_m_w;
	m_h = old_m_h;
	if (!am_followplayer)
	{
		m_x = old_m_x;
		m_y = old_m_y;
    }
	else
	{
		m_x = players[consoleplayer].camera->X() - m_w/2;
		m_y = players[consoleplayer].camera->Y() - m_h/2;
    }
	m_x2 = m_x + m_w;
	m_y2 = m_y + m_h;

	// Change the scaling multipliers
	scale_mtof = f_w / m_w;
	scale_ftom = 1. / scale_mtof;
}